

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O2

void hrstep2(double *inp,int N,int m,int p,int q,int pq,double *a,double *sos,double *var)

{
  double *sig;
  double *col;
  double *C;
  double *C_00;
  double *x;
  int *ipiv;
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  uint rows;
  long lVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  
  rows = N - (q + m);
  lVar9 = (long)pq;
  sVar11 = (int)rows * lVar9 * 8;
  sig = (double *)malloc(sVar11);
  col = (double *)malloc(sVar11);
  sVar11 = lVar9 * 8;
  C = (double *)malloc(sVar11 * lVar9);
  C_00 = (double *)malloc(sVar11);
  x = (double *)malloc(sVar11);
  ipiv = (int *)malloc(lVar9 << 2);
  uVar1 = 0;
  uVar12 = 0;
  if (0 < p) {
    uVar12 = (ulong)(uint)p;
  }
  uVar10 = 0;
  if (0 < q) {
    uVar10 = (ulong)(uint)q;
  }
  lVar4 = (long)(q + m);
  uVar2 = 0;
  if (0 < (int)rows) {
    uVar2 = (ulong)rows;
  }
  pdVar3 = sig + p;
  lVar5 = (lVar4 << 0x20) + -0x100000000;
  pdVar6 = sig;
  for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    lVar7 = lVar5;
    for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      pdVar6[uVar8] = *(double *)((long)inp + (lVar7 >> 0x1d));
      lVar7 = lVar7 + -0x100000000;
    }
    lVar7 = lVar5;
    for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      pdVar3[uVar8] = -*(double *)((long)a + (lVar7 >> 0x1d));
      lVar7 = lVar7 + -0x100000000;
    }
    pdVar6 = pdVar6 + lVar9;
    lVar5 = lVar5 + 0x100000000;
    pdVar3 = pdVar3 + lVar9;
  }
  mtranspose(sig,rows,pq,col);
  mmult(col,sig,C,pq,rows,pq);
  mmult(col,inp + (long)m + (long)q,C_00,pq,rows,1);
  ludecomp(C,pq,ipiv);
  linsolve(C,pq,C_00,ipiv,x);
  *sos = 0.0;
  lVar9 = (lVar4 << 0x20) + -0x100000000;
  dVar13 = 0.0;
  for (; lVar4 < N; lVar4 = lVar4 + 1) {
    dVar14 = inp[lVar4];
    lVar5 = lVar9;
    for (uVar1 = 0; uVar12 != uVar1; uVar1 = uVar1 + 1) {
      dVar14 = dVar14 - x[uVar1] * *(double *)((long)inp + (lVar5 >> 0x1d));
      lVar5 = lVar5 + -0x100000000;
    }
    lVar5 = lVar9;
    for (uVar1 = 0; uVar10 != uVar1; uVar1 = uVar1 + 1) {
      dVar14 = dVar14 + x[(long)p + uVar1] * *(double *)((long)a + (lVar5 >> 0x1d));
      lVar5 = lVar5 + -0x100000000;
    }
    dVar13 = dVar13 + dVar14 * dVar14;
    *sos = dVar13;
    lVar9 = lVar9 + 0x100000000;
  }
  *var = dVar13 / (double)(int)rows;
  free(sig);
  free(col);
  free(C);
  free(C_00);
  free(ipiv);
  free(x);
  return;
}

Assistant:

void hrstep2(double *inp, int N, int m, int p, int q, int pq, double *a, double *sos, double *var) {
	double *z, *zt, *A, *b, *temp;
	int *ipiv;
	int i,j,k,t;
	double wmean;

	z = (double*)malloc(sizeof(double)* (N - m - q) * pq);
	zt = (double*)malloc(sizeof(double)* (N - m - q) * pq);
	A = (double*)malloc(sizeof(double)* pq * pq);
	b = (double*)malloc(sizeof(double)* pq);
	temp = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	for (i = 0; i < N - m - q; ++i) {
		t = i * pq;
		for (j = 0; j < p; ++j) {
			z[t + j] = inp[m + q + i - j - 1];
		}

		for (k = 0; k < q; ++k) {
			z[t + p + k] = -a[m + q + i - k - 1];
		}
	}

	mtranspose(z, N - m - q, pq, zt);
	mmult(zt, z, A, pq, N - m - q, pq);
	mmult(zt, inp + m + q, b, pq, N - m - q, 1);


	ludecomp(A, pq, ipiv);
	linsolve(A, pq, b, ipiv, temp);

	*sos = 0.0;

	for (t = m + q; t < N; ++t) {
		wmean = inp[t];
		for (i = 0; i < p; ++i) {
			wmean -= (temp[i] * inp[t - i - 1]);
		}

		for (i = 0; i < q; ++i) {
			wmean += (temp[i+p] * a[t - i - 1]);
		}

		*sos += (wmean*wmean);
	}

	*var = *sos / (N - m - q);

	free(z);
	free(zt);
	free(A);
	free(b);
	free(ipiv);
	free(temp);
}